

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::MessageLite::SerializePartialToCodedStream
          (MessageLite *this,CodedOutputStream *output)

{
  ulong byte_size_before_serialization;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  LogMessage *pLVar5;
  undefined4 extraout_var_00;
  int final_byte_count;
  int original_byte_count;
  string local_80;
  LogMessage local_60;
  ulong local_28;
  size_t size;
  CodedOutputStream *output_local;
  MessageLite *this_local;
  
  size = (size_t)output;
  output_local = (CodedOutputStream *)this;
  iVar2 = (*this->_vptr_MessageLite[8])();
  local_28 = CONCAT44(extraout_var,iVar2);
  if (local_28 < 0x80000000) {
    iVar2 = io::CodedOutputStream::ByteCount((CodedOutputStream *)size);
    SerializeWithCachedSizes(this,(CodedOutputStream *)size);
    bVar1 = io::CodedOutputStream::HadError((CodedOutputStream *)size);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      iVar3 = io::CodedOutputStream::ByteCount((CodedOutputStream *)size);
      byte_size_before_serialization = local_28;
      if ((long)(iVar3 - iVar2) != local_28) {
        iVar4 = (*this->_vptr_MessageLite[8])();
        anon_unknown_13::ByteSizeConsistencyError
                  (byte_size_before_serialization,CONCAT44(extraout_var_00,iVar4),
                   (long)(iVar3 - iVar2),this);
      }
      this_local._7_1_ = true;
    }
  }
  else {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message_lite.cc"
               ,0x175);
    (*this->_vptr_MessageLite[2])(&local_80);
    pLVar5 = internal::LogMessage::operator<<(&local_60,&local_80);
    pLVar5 = internal::LogMessage::operator<<(pLVar5," exceeded maximum protobuf size of 2GB: ");
    pLVar5 = internal::LogMessage::operator<<(pLVar5,local_28);
    internal::LogFinisher::operator=((LogFinisher *)((long)&final_byte_count + 3),pLVar5);
    std::__cxx11::string::~string((string *)&local_80);
    internal::LogMessage::~LogMessage(&local_60);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MessageLite::SerializePartialToCodedStream(
    io::CodedOutputStream* output) const {
  const size_t size = ByteSizeLong();  // Force size to be cached.
  if (size > INT_MAX) {
    GOOGLE_LOG(ERROR) << GetTypeName()
               << " exceeded maximum protobuf size of 2GB: " << size;
    return false;
  }

  int original_byte_count = output->ByteCount();
  SerializeWithCachedSizes(output);
  if (output->HadError()) {
    return false;
  }
  int final_byte_count = output->ByteCount();

  if (final_byte_count - original_byte_count != static_cast<int64_t>(size)) {
    ByteSizeConsistencyError(size, ByteSizeLong(),
                             final_byte_count - original_byte_count, *this);
  }

  return true;
}